

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_NtkBalanceTwo(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,int i,int j,Vec_Int_t *vDelay,
                     int *pCost,int *pSuper,word *pMatrix,int nSize,int nLutSize,int CostBest)

{
  ulong *puVar1;
  word wVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  if (j <= i) {
    __assert_fail("i < j",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0x41f,
                  "int Str_NtkBalanceTwo(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, int, int, Vec_Int_t *, int *, int *, word *, int, int, int)"
                 );
  }
  lVar6 = (long)j;
  if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
    uVar3 = Gia_ManHashAnd(pNew,pSuper[i],pSuper[lVar6]);
  }
  else {
    uVar3 = Gia_ManHashXorReal(pNew,pSuper[i],pSuper[lVar6]);
  }
  if (-1 < (int)uVar3) {
    iVar4 = Str_ObjDelay(pNew,uVar3 >> 1,nLutSize,vDelay);
    pCost[i] = iVar4;
    pSuper[i] = uVar3;
    pMatrix[i] = pMatrix[i] | pMatrix[lVar6];
    if (j < nSize + -1) {
      do {
        pCost[lVar6] = pCost[lVar6 + 1];
        pSuper[lVar6] = pSuper[lVar6 + 1];
        pMatrix[lVar6] = pMatrix[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (nSize + -1 != lVar6);
    }
    if (2 < nSize) {
      uVar5 = 0;
      do {
        iVar4 = pCost[uVar5];
        if (iVar4 <= pCost[uVar5 + 1]) {
          return uVar3;
        }
        pCost[uVar5] = pCost[uVar5 + 1];
        pCost[uVar5 + 1] = iVar4;
        puVar1 = (ulong *)(pSuper + uVar5);
        *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        wVar2 = pMatrix[uVar5];
        pMatrix[uVar5] = pMatrix[uVar5 + 1];
        pMatrix[uVar5 + 1] = wVar2;
        uVar5 = uVar5 + 1;
      } while (nSize - 2 != uVar5);
    }
    return uVar3;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Str_NtkBalanceTwo( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, int i, int j, Vec_Int_t * vDelay, int * pCost, int * pSuper, word * pMatrix, int nSize, int nLutSize, int CostBest )
{
    int k, iLitRes, Delay;
    assert( i < j );
//    printf( "Merging node %d and %d\n", i, j );
    if ( pObj->Type == STR_AND )
        iLitRes = Gia_ManHashAnd( pNew, pSuper[i], pSuper[j] );
    else
        iLitRes = Gia_ManHashXorReal( pNew, pSuper[i], pSuper[j] );
    Delay = Str_ObjDelay( pNew, Abc_Lit2Var(iLitRes), nLutSize, vDelay );
    // update
    pCost[i] = Delay;
    pSuper[i] = iLitRes;
    pMatrix[i] |= pMatrix[j];
//    assert( (pCost[i] & 15) == CostBest || CostBest == -1 );
    // remove entry j
    nSize--;
    for ( k = j; k < nSize; k++ )
    {
        pCost[k] = pCost[k+1];
        pSuper[k] = pSuper[k+1];
        pMatrix[k] = pMatrix[k+1];
    }
    // move up the first one
    nSize--;
    for ( k = 0; k < nSize; k++ )
    {
        if ( pCost[k] <= pCost[k+1] )
            break;
        ABC_SWAP( int, pCost[k], pCost[k+1] );
        ABC_SWAP( int, pSuper[k], pSuper[k+1] );
        ABC_SWAP( word, pMatrix[k], pMatrix[k+1] );
    }
    return iLitRes;
}